

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_compress_image(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long tilelen;
  size_t __size;
  char *pcVar18;
  double *nullflagval;
  int anynul;
  double *local_268;
  int local_25c;
  int *local_258;
  int local_24c;
  fitsfile *local_248;
  long local_240;
  int local_238;
  float fltnull;
  fitsfile *local_230;
  long ntrows;
  long trowsize;
  long naxes [6];
  double dblnull;
  double dummy;
  long local_178 [6];
  long lpixel [6];
  long tilesize [6];
  long fpixel [6];
  long alStack_b8 [5];
  long local_90;
  char card [81];
  
  dummy = 0.0;
  dblnull = -9.1191291391491e-36;
  fltnull = -9.11912e-36;
  local_178[0] = 1;
  local_178[1] = 1;
  local_178[2] = 1;
  local_178[3] = 1;
  local_178[4] = 1;
  local_178[5] = 1;
  iVar17 = *status;
  if (0 < iVar17) {
    return iVar17;
  }
  pFVar1 = outfptr->Fptr;
  __size = pFVar1->maxtilelen;
  local_238 = pFVar1->zbitpix;
  if (local_238 == -0x20) {
    local_25c = 0x2a;
    if (pFVar1->compress_type == 0x29) {
      iVar2 = 3;
    }
    else {
      iVar2 = 2;
    }
    bVar6 = false;
LAB_001bc151:
    bVar3 = false;
LAB_001bc159:
    __size = __size << iVar2;
    bVar4 = false;
LAB_001bc161:
    bVar5 = false;
  }
  else {
    if (local_238 == 0x20) {
      local_25c = 0x1f;
      if (pFVar1->compress_type == 0x29) {
        iVar2 = 3;
      }
      else {
        iVar2 = 2;
      }
      bVar3 = true;
      bVar6 = false;
      goto LAB_001bc159;
    }
    if (local_238 != 8) {
      if (local_238 != 0x10) {
        if (local_238 != -0x40) {
          pcVar18 = "Bad image datatype. (imcomp_compress_image)";
          goto LAB_001bc7c9;
        }
        iVar2 = 3;
        local_25c = 0x52;
        bVar6 = true;
        goto LAB_001bc151;
      }
      uVar9 = pFVar1->compress_type + 1;
      local_25c = 0x15;
      if ((uVar9 < 0x35) && ((0x10000000c01001U >> ((ulong)uVar9 & 0x3f) & 1) != 0)) {
        __size = __size * 2;
      }
      else {
        __size = __size << 2;
      }
      bVar4 = true;
      bVar6 = false;
      bVar3 = false;
      goto LAB_001bc161;
    }
    local_25c = 0xb;
    bVar5 = true;
    if ((0x33 < (ulong)(uint)pFVar1->compress_type) ||
       ((0x8000000600800U >> ((ulong)(uint)pFVar1->compress_type & 0x3f) & 1) == 0)) {
      __size = __size << 2;
    }
    bVar6 = false;
    bVar3 = false;
    bVar4 = false;
  }
  local_268 = (double *)malloc(__size);
  if (local_268 != (double *)0x0) {
    iVar2 = pFVar1->zndim;
    for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
      lVar16 = 1;
      lVar11 = 1;
      if (lVar10 < iVar2) {
        lVar16 = pFVar1->tilesize[lVar10];
        lVar11 = pFVar1->znaxis[lVar10];
      }
      naxes[lVar10] = lVar11;
      tilesize[lVar10] = lVar16;
    }
    local_24c = 0;
    local_240 = 1;
    lVar10 = 1;
    local_258 = status;
    local_248 = infptr;
    local_230 = outfptr;
    do {
      if (naxes[5] < lVar10) {
        free(local_268);
        piVar7 = local_258;
        if (local_24c == 0) {
          return iVar17;
        }
        ffgcrd(outfptr,"ZCMPTYPE",card,local_258);
        ffikyj(outfptr,"ZBLANK",-0x7fffffff,"null value in the compressed integer array",piVar7);
        return *piVar7;
      }
      lVar16 = tilesize[5] + lVar10;
      lpixel[5] = tilesize[5] + -1 + lVar10;
      if (naxes[5] < lVar16) {
        lpixel[5] = naxes[5];
      }
      local_90 = (lpixel[5] - lVar10) + 1;
      lVar11 = 1;
      fpixel[5] = lVar10;
      while (lVar10 = lVar16, lVar11 <= naxes[4]) {
        lVar10 = tilesize[4] + lVar11;
        lpixel[4] = tilesize[4] + -1 + lVar11;
        if (naxes[4] < lVar10) {
          lpixel[4] = naxes[4];
        }
        alStack_b8[4] = (lpixel[4] - lVar11) + 1;
        lVar12 = 1;
        fpixel[4] = lVar11;
        while (lVar11 = lVar10, lVar12 <= naxes[3]) {
          lVar11 = tilesize[3] + lVar12;
          lpixel[3] = tilesize[3] + -1 + lVar12;
          if (naxes[3] < lVar11) {
            lpixel[3] = naxes[3];
          }
          alStack_b8[3] = (lpixel[3] - lVar12) + 1;
          lVar13 = 1;
          fpixel[3] = lVar12;
          while (lVar12 = lVar11, lVar13 <= naxes[2]) {
            lVar12 = tilesize[2] + lVar13;
            lpixel[2] = tilesize[2] + -1 + lVar13;
            if (naxes[2] < lVar12) {
              lpixel[2] = naxes[2];
            }
            alStack_b8[2] = (lpixel[2] - lVar13) + 1;
            lVar15 = 1;
            fpixel[2] = lVar13;
            while (lVar13 = lVar12, lVar15 <= naxes[1]) {
              lVar13 = tilesize[1] + lVar15;
              lpixel[1] = tilesize[1] + -1 + lVar15;
              if (naxes[1] < lVar13) {
                lpixel[1] = naxes[1];
              }
              alStack_b8[1] = (lpixel[1] - lVar15) + 1;
              lVar14 = 1;
              fpixel[1] = lVar15;
              while (iVar8 = local_238, piVar7 = local_258, lVar15 = lVar13, lVar14 <= naxes[0]) {
                lpixel[0] = tilesize[0] + -1 + lVar14;
                if (naxes[0] < tilesize[0] + lVar14) {
                  lpixel[0] = naxes[0];
                }
                tilelen = (lpixel[0] - lVar14) + 1;
                for (lVar15 = 1; lVar15 < iVar2; lVar15 = lVar15 + 1) {
                  tilelen = tilelen * alStack_b8[lVar15];
                }
                anynul = 0;
                fpixel[0] = lVar14;
                if (local_238 == -0x20) {
                  ffgsve(local_248,1,iVar2,naxes,fpixel,lpixel,local_178,-9.11912e-36,
                         (float *)local_268,&anynul,local_258);
                }
                else if (bVar6) {
                  ffgsvd(local_248,1,iVar2,naxes,fpixel,lpixel,local_178,-9.1191291391491e-36,
                         local_268,&anynul,local_258);
                }
                else if (bVar3) {
                  ffgsvk(local_248,1,iVar2,naxes,fpixel,lpixel,local_178,0,(int *)local_268,&anynul,
                         local_258);
                }
                else if (bVar4) {
                  ffgsvi(local_248,1,iVar2,naxes,fpixel,lpixel,local_178,0,(short *)local_268,
                         &anynul,local_258);
                }
                else {
                  if (!bVar5) {
                    pcVar18 = "Error bad datatype of image tile to compress";
                    goto LAB_001bc6ea;
                  }
                  ffgsvb(local_248,1,iVar2,naxes,fpixel,lpixel,local_178,'\0',(uchar *)local_268,
                         &anynul,local_258);
                }
                fits_calc_tile_rows(lpixel,fpixel,iVar2,&trowsize,&ntrows,piVar7);
                outfptr = local_230;
                if (anynul == 0 || iVar8 != -0x20) {
                  if (!bVar6 || anynul == 0) {
                    nullflagval = &dummy;
                    iVar17 = local_25c;
                  }
                  else {
                    nullflagval = &dblnull;
                    iVar17 = 0x52;
                  }
                  uVar9 = (uint)(bVar6 && anynul != 0);
                }
                else {
                  iVar17 = 0x2a;
                  nullflagval = (double *)&fltnull;
                  uVar9 = 1;
                }
                imcomp_compress_tile
                          (local_230,local_240,iVar17,local_268,tilelen,trowsize,ntrows,uVar9,
                           nullflagval,piVar7);
                iVar17 = *piVar7;
                if (0 < iVar17) {
                  pcVar18 = "Error writing compressed image to table";
LAB_001bc6ea:
                  ffpmsg(pcVar18);
                  free(local_268);
                  return *local_258;
                }
                if (anynul != 0) {
                  local_24c = 1;
                }
                local_240 = local_240 + 1;
                lVar14 = tilesize[0] + lVar14;
              }
            }
          }
        }
      }
    } while( true );
  }
  pcVar18 = "Out of memory. (imcomp_compress_image)";
  local_268 = (double *)0x0;
LAB_001bc7c9:
  ffpmsg(pcVar18);
  *status = 0x71;
  return 0x71;
}

Assistant:

int imcomp_compress_image (fitsfile *infptr, fitsfile *outfptr, int *status)

/* This routine does the following:
        - reads an image one tile at a time
        - if it is a float or double image, then it tries to quantize the pixels
          into scaled integers.
        - it then compressess the integer pixels, or if the it was not
	  possible to quantize the floating point pixels, then it losslessly
	  compresses them with gzip
	- writes the compressed byte stream to the output FITS file
*/
{
    double *tiledata;
    int anynul, gotnulls = 0, datatype;
    long ii, row;
    int naxis;
    double dummy = 0., dblnull = DOUBLENULLVALUE;
    float fltnull = FLOATNULLVALUE;
    long maxtilelen, tilelen, incre[] = {1, 1, 1, 1, 1, 1};
    long naxes[MAX_COMPRESS_DIM], fpixel[MAX_COMPRESS_DIM];
    long lpixel[MAX_COMPRESS_DIM], tile[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM];
    long i0, i1, i2, i3, i4, i5, trowsize, ntrows;
    char card[FLEN_CARD];

    if (*status > 0)
        return(*status);

    maxtilelen = (outfptr->Fptr)->maxtilelen;

    /* 
     Allocate buffer to hold 1 tile of data; size depends on which compression 
     algorithm is used:

      Rice and GZIP will compress byte, short, or int arrays without conversion.
      PLIO requires 4-byte int values, so byte and short arrays must be converted to int.
      HCompress internally converts byte or short values to ints, and
         converts int values to 8-byte longlong integers.
    */
    
    if ((outfptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        datatype = TFLOAT;

        if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1) {
	    /* need twice as much scratch space (8 bytes per pixel) */
            tiledata = (double*) malloc (maxtilelen * 2 *sizeof (float));	
	} else {
            tiledata = (double*) malloc (maxtilelen * sizeof (float));
	}
    }
    else if ((outfptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        datatype = TDOUBLE;
        tiledata = (double*) malloc (maxtilelen * sizeof (double));
    }
    else if ((outfptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
        if ( (outfptr->Fptr)->compress_type == RICE_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_2  ||
	     (outfptr->Fptr)->compress_type == BZIP2_1 ||
             (outfptr->Fptr)->compress_type == NOCOMPRESS) {
	    /* only need  buffer of I*2 pixels for gzip, bzip2, and Rice */

            tiledata = (double*) malloc (maxtilelen * sizeof (short));	
	} else {
 	    /*  need  buffer of I*4 pixels for Hcompress and PLIO */
            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else if ((outfptr->Fptr)->zbitpix == BYTE_IMG)
    {

        datatype = TBYTE;
        if ( (outfptr->Fptr)->compress_type == RICE_1  ||
	     (outfptr->Fptr)->compress_type == BZIP2_1 ||
	     (outfptr->Fptr)->compress_type == GZIP_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_2) {
	    /* only need  buffer of I*1 pixels for gzip, bzip2, and Rice */

            tiledata = (double*) malloc (maxtilelen);	
	} else {
 	    /*  need  buffer of I*4 pixels for Hcompress and PLIO */
            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else if ((outfptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
        if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1) {
	    /* need twice as much scratch space (8 bytes per pixel) */

            tiledata = (double*) malloc (maxtilelen * 2 * sizeof (int));	
	} else {
 	    /* only need  buffer of I*4 pixels for gzip, bzip2,  Rice, and PLIO */

            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else
    {
	ffpmsg("Bad image datatype. (imcomp_compress_image)");
	return (*status = MEMORY_ALLOCATION);
    }
    
    if (tiledata == NULL)
    {
	ffpmsg("Out of memory. (imcomp_compress_image)");
	return (*status = MEMORY_ALLOCATION);
    }

    /*  calculate size of tile in each dimension */
    naxis = (outfptr->Fptr)->zndim;
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        if (ii < naxis)
        {
             naxes[ii] = (outfptr->Fptr)->znaxis[ii];
             tilesize[ii] = (outfptr->Fptr)->tilesize[ii];
        }
        else
        {
            naxes[ii] = 1;
            tilesize[ii] = 1;
        }
    }
    row = 1;

    /* set up big loop over up to 6 dimensions */
    for (i5 = 1; i5 <= naxes[5]; i5 += tilesize[5])
    {
     fpixel[5] = i5;
     lpixel[5] = minvalue(i5 + tilesize[5] - 1, naxes[5]);
     tile[5] = lpixel[5] - fpixel[5] + 1;
     for (i4 = 1; i4 <= naxes[4]; i4 += tilesize[4])
     {
      fpixel[4] = i4;
      lpixel[4] = minvalue(i4 + tilesize[4] - 1, naxes[4]);
      tile[4] = lpixel[4] - fpixel[4] + 1;
      for (i3 = 1; i3 <= naxes[3]; i3 += tilesize[3])
      {
       fpixel[3] = i3;
       lpixel[3] = minvalue(i3 + tilesize[3] - 1, naxes[3]);
       tile[3] = lpixel[3] - fpixel[3] + 1;
       for (i2 = 1; i2 <= naxes[2]; i2 += tilesize[2])
       {
        fpixel[2] = i2;
        lpixel[2] = minvalue(i2 + tilesize[2] - 1, naxes[2]);
        tile[2] = lpixel[2] - fpixel[2] + 1;
        for (i1 = 1; i1 <= naxes[1]; i1 += tilesize[1])
        {
         fpixel[1] = i1;
         lpixel[1] = minvalue(i1 + tilesize[1] - 1, naxes[1]);
         tile[1] = lpixel[1] - fpixel[1] + 1;
         for (i0 = 1; i0 <= naxes[0]; i0 += tilesize[0])
         {
          fpixel[0] = i0;
          lpixel[0] = minvalue(i0 + tilesize[0] - 1, naxes[0]);
          tile[0] = lpixel[0] - fpixel[0] + 1;

          /* number of pixels in this tile */
          tilelen = tile[0];
          for (ii = 1; ii < naxis; ii++)
          {
             tilelen *= tile[ii];
          }

          /* read next tile of data from image */
	  anynul = 0;
          if (datatype == TFLOAT)
          {
              ffgsve(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  FLOATNULLVALUE, (float *) tiledata,  &anynul, status);
          }
          else if (datatype == TDOUBLE)
          {
              ffgsvd(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  DOUBLENULLVALUE, tiledata, &anynul, status);
          }
          else if (datatype == TINT)
          {
              ffgsvk(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (int *) tiledata,  &anynul, status);
          }
          else if (datatype == TSHORT)
          {
              ffgsvi(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (short *) tiledata,  &anynul, status);
          }
          else if (datatype == TBYTE)
          {
              ffgsvb(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (unsigned char *) tiledata,  &anynul, status);
          }
          else 
          {
              ffpmsg("Error bad datatype of image tile to compress");
              free(tiledata);
              return (*status);
          }

          /* now compress the tile, and write to row of binary table */
          /*   NOTE: we don't have to worry about the presence of null values in the
	       array if it is an integer array:  the null value is simply encoded
	       in the compressed array just like any other pixel value.  
	       
	       If it is a floating point array, then we need to check for null
	       only if the anynul parameter returned a true value when reading the tile
	  */
          
          /* Collapse sizes of higher dimension tiles into 2 dimensional
             equivalents needed by the quantizing algorithms for
             floating point types */
          fits_calc_tile_rows(lpixel, fpixel, naxis, &trowsize,
                            &ntrows, status);

          if (anynul && datatype == TFLOAT) {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 1, &fltnull, status);
          } else if (anynul && datatype == TDOUBLE) {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 1, &dblnull, status);
          } else {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 0, &dummy, status);
          }

          /* set flag if we found any null values */
          if (anynul)
              gotnulls = 1;

          /* check for any error in the previous operations */
          if (*status > 0)
          {
              ffpmsg("Error writing compressed image to table");
              free(tiledata);
              return (*status);
          }

	  row++;
         }
        }
       }
      }
     }
    }

    free (tiledata);  /* finished with this buffer */

    /* insert ZBLANK keyword if necessary; only for TFLOAT or TDOUBLE images */
    if (gotnulls)
    {
          ffgcrd(outfptr, "ZCMPTYPE", card, status);
          ffikyj(outfptr, "ZBLANK", COMPRESS_NULL_VALUE, 
             "null value in the compressed integer array", status);
    }

    return (*status);
}